

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

int32 feat_s2mfc2feat_live
                (feat_t *fcb,mfcc_t **uttcep,int32 *inout_ncep,int32 beginutt,int32 endutt,
                mfcc_t ***ofeat)

{
  int iVar1;
  int local_58;
  int32 tmppos;
  int32 tpos;
  int32 zero;
  int32 nfeatvec;
  int32 j;
  int32 i;
  int32 nbufcep;
  int32 cepsize;
  int32 win;
  mfcc_t ***ofeat_local;
  int32 endutt_local;
  int32 beginutt_local;
  int32 *inout_ncep_local;
  mfcc_t **uttcep_local;
  feat_t *fcb_local;
  
  tmppos = 0;
  _endutt_local = inout_ncep;
  if (inout_ncep == (int32 *)0x0) {
    _endutt_local = &tmppos;
  }
  _cepsize = ofeat;
  ofeat_local._0_4_ = endutt;
  ofeat_local._4_4_ = beginutt;
  inout_ncep_local = (int32 *)uttcep;
  uttcep_local = (mfcc_t **)fcb;
  if (((beginutt == 0) || (endutt == 0)) || (*_endutt_local < 1)) {
    nbufcep = fcb->window_size;
    i = fcb->cepsize;
    if (beginutt != 0) {
      fcb->bufpos = fcb->curpos;
    }
    j = fcb->bufpos - fcb->curpos;
    if (j < 0) {
      j = (fcb->bufpos + 0x100) - fcb->curpos;
    }
    if ((beginutt != 0) && (0 < *_endutt_local)) {
      j = nbufcep + j;
    }
    if (endutt != 0) {
      j = nbufcep + j;
    }
    if (0x100 < j + *_endutt_local) {
      *_endutt_local = (0x100 - j) - nbufcep;
      ofeat_local._0_4_ = 0;
    }
    feat_cmn((feat_t *)uttcep_local,(mfcc_t **)inout_ncep_local,*_endutt_local,ofeat_local._4_4_,
             (int32)ofeat_local);
    feat_agc((feat_t *)uttcep_local,(mfcc_t **)inout_ncep_local,*_endutt_local,ofeat_local._4_4_,
             (int32)ofeat_local);
    if ((ofeat_local._4_4_ != 0) && (0 < *_endutt_local)) {
      for (nfeatvec = 0; nfeatvec < nbufcep; nfeatvec = nfeatvec + 1) {
        iVar1 = *(int *)(uttcep_local + 0xf);
        *(int *)(uttcep_local + 0xf) = iVar1 + 1;
        memcpy(*(void **)(uttcep_local[0xd] + (long)iVar1 * 2),*(void **)inout_ncep_local,
               (long)i << 2);
        *(int *)(uttcep_local + 0xf) = *(int *)(uttcep_local + 0xf) % 0x100;
      }
      *(undefined4 *)((long)uttcep_local + 0x7c) = *(undefined4 *)(uttcep_local + 0xf);
      j = j - nbufcep;
    }
    for (nfeatvec = 0; nfeatvec < *_endutt_local; nfeatvec = nfeatvec + 1) {
      iVar1 = *(int *)(uttcep_local + 0xf);
      *(int *)(uttcep_local + 0xf) = iVar1 + 1;
      memcpy(*(void **)(uttcep_local[0xd] + (long)iVar1 * 2),
             *(void **)(inout_ncep_local + (long)nfeatvec * 2),(long)i << 2);
      *(int *)(uttcep_local + 0xf) = *(int *)(uttcep_local + 0xf) % 0x100;
      j = j + 1;
    }
    if ((int32)ofeat_local != 0) {
      if (*(int *)(uttcep_local + 0xf) == 0) {
        local_58 = 0xff;
      }
      else {
        local_58 = *(int *)(uttcep_local + 0xf) + -1;
      }
      for (nfeatvec = 0; nfeatvec < nbufcep; nfeatvec = nfeatvec + 1) {
        iVar1 = *(int *)(uttcep_local + 0xf);
        *(int *)(uttcep_local + 0xf) = iVar1 + 1;
        memcpy(*(void **)(uttcep_local[0xd] + (long)iVar1 * 2),
               *(void **)(uttcep_local[0xd] + (long)local_58 * 2),(long)i << 2);
        *(int *)(uttcep_local + 0xf) = *(int *)(uttcep_local + 0xf) % 0x100;
      }
    }
    tpos = j - nbufcep;
    if (tpos < 1) {
      fcb_local._4_4_ = 0;
    }
    else {
      for (nfeatvec = 0; nfeatvec < tpos; nfeatvec = nfeatvec + 1) {
        if ((*(int *)((long)uttcep_local + 0x7c) - nbufcep < 0) ||
           (0xff < *(int *)((long)uttcep_local + 0x7c) + nbufcep)) {
          for (zero = -nbufcep; zero <= nbufcep; zero = zero + 1) {
            *(undefined8 *)(uttcep_local[0xe] + (long)(nbufcep + zero) * 2) =
                 *(undefined8 *)
                  (uttcep_local[0xd] +
                  (long)((*(int *)((long)uttcep_local + 0x7c) + zero + 0x100) % 0x100) * 2);
          }
          (*(code *)uttcep_local[10])
                    (uttcep_local,uttcep_local[0xe] + (long)nbufcep * 2,_cepsize[nfeatvec]);
        }
        else {
          (*(code *)uttcep_local[10])
                    (uttcep_local,uttcep_local[0xd] + (long)*(int *)((long)uttcep_local + 0x7c) * 2,
                     _cepsize[nfeatvec]);
        }
        *(int *)((long)uttcep_local + 0x7c) = *(int *)((long)uttcep_local + 0x7c) + 1;
        *(int *)((long)uttcep_local + 0x7c) = *(int *)((long)uttcep_local + 0x7c) % 0x100;
      }
      if (uttcep_local[0x10] != (mfcc_t *)0x0) {
        feat_lda_transform((feat_t *)uttcep_local,_cepsize,tpos);
      }
      if (uttcep_local[6] != (mfcc_t *)0x0) {
        feat_subvec_project((feat_t *)uttcep_local,_cepsize,tpos);
      }
      fcb_local._4_4_ = tpos;
    }
  }
  else {
    fcb_local._4_4_ = feat_s2mfc2feat_block_utt(fcb,uttcep,*_endutt_local,ofeat);
  }
  return fcb_local._4_4_;
}

Assistant:

int32
feat_s2mfc2feat_live(feat_t * fcb, mfcc_t ** uttcep, int32 *inout_ncep,
		     int32 beginutt, int32 endutt, mfcc_t *** ofeat)
{
    int32 win, cepsize, nbufcep;
    int32 i, j, nfeatvec;
    int32 zero = 0;

    /* Avoid having to check this everywhere. */
    if (inout_ncep == NULL) inout_ncep = &zero;

    /* Special case for entire utterances. */
    if (beginutt && endutt && *inout_ncep > 0)
        return feat_s2mfc2feat_block_utt(fcb, uttcep, *inout_ncep, ofeat);

    win = feat_window_size(fcb);
    cepsize = feat_cepsize(fcb);

    /* Empty the input buffer on start of utterance. */
    if (beginutt)
        fcb->bufpos = fcb->curpos;

    /* Calculate how much data is in the buffer already. */
    nbufcep = fcb->bufpos - fcb->curpos;
    if (nbufcep < 0)
	nbufcep = fcb->bufpos + LIVEBUFBLOCKSIZE - fcb->curpos;
    /* Add any data that we have to replicate. */
    if (beginutt && *inout_ncep > 0)
        nbufcep += win;
    if (endutt)
        nbufcep += win;

    /* Only consume as much input as will fit in the buffer. */
    if (nbufcep + *inout_ncep > LIVEBUFBLOCKSIZE) {
        /* We also can't overwrite the trailing window, hence the
         * reason why win is subtracted here. */
        *inout_ncep = LIVEBUFBLOCKSIZE - nbufcep - win;
        /* Cancel end of utterance processing. */
        endutt = FALSE;
    }

    /* FIXME: Don't modify the input! */
    feat_cmn(fcb, uttcep, *inout_ncep, beginutt, endutt);
    feat_agc(fcb, uttcep, *inout_ncep, beginutt, endutt);

    /* Replicate first frame into the first win frames if we're at the
     * beginning of the utterance and there was some actual input to
     * deal with.  (FIXME: Not entirely sure why that condition) */
    if (beginutt && *inout_ncep > 0) {
        for (i = 0; i < win; i++) {
            memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[0],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
        /* Move the current pointer past this data. */
        fcb->curpos = fcb->bufpos;
        nbufcep -= win;
    }

    /* Copy in frame data to the circular buffer. */
    for (i = 0; i < *inout_ncep; ++i) {
        memcpy(fcb->cepbuf[fcb->bufpos++], uttcep[i],
               cepsize * sizeof(mfcc_t));
        fcb->bufpos %= LIVEBUFBLOCKSIZE;
	++nbufcep;
    }

    /* Replicate last frame into the last win frames if we're at the
     * end of the utterance (even if there was no input, so we can
     * flush the output). */
    if (endutt) {
        int32 tpos; /* Index of last input frame. */
        if (fcb->bufpos == 0)
            tpos = LIVEBUFBLOCKSIZE - 1;
        else
            tpos = fcb->bufpos - 1;
        for (i = 0; i < win; ++i) {
            memcpy(fcb->cepbuf[fcb->bufpos++], fcb->cepbuf[tpos],
                   cepsize * sizeof(mfcc_t));
            fcb->bufpos %= LIVEBUFBLOCKSIZE;
        }
    }

    /* We have to leave the trailing window of frames. */
    nfeatvec = nbufcep - win;
    if (nfeatvec <= 0)
        return 0; /* Do nothing. */

    for (i = 0; i < nfeatvec; ++i) {
        /* Handle wraparound cases. */
        if (fcb->curpos - win < 0 || fcb->curpos + win >= LIVEBUFBLOCKSIZE) {
            /* Use tmpcepbuf for this case.  Actually, we just need the pointers. */
            for (j = -win; j <= win; ++j) {
                int32 tmppos =
                    (fcb->curpos + j + LIVEBUFBLOCKSIZE) % LIVEBUFBLOCKSIZE;
		fcb->tmpcepbuf[win + j] = fcb->cepbuf[tmppos];
            }
            fcb->compute_feat(fcb, fcb->tmpcepbuf + win, ofeat[i]);
        }
        else {
            fcb->compute_feat(fcb, fcb->cepbuf + fcb->curpos, ofeat[i]);
        }
	/* Move the read pointer forward. */
        ++fcb->curpos;
        fcb->curpos %= LIVEBUFBLOCKSIZE;
    }

    if (fcb->lda)
        feat_lda_transform(fcb, ofeat, nfeatvec);

    if (fcb->subvecs)
        feat_subvec_project(fcb, ofeat, nfeatvec);

    return nfeatvec;
}